

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::HasZero(Constant *c)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this;
  reference ppCVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Constant **comp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range3;
  VectorConstant *vec_const;
  Constant *c_local;
  
  iVar3 = (*c->_vptr_Constant[0x16])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*c->_vptr_Constant[0x13])();
    if ((long *)CONCAT44(extraout_var_00,iVar3) == (long *)0x0) {
      iVar3 = (*c->_vptr_Constant[0xd])();
      if (CONCAT44(extraout_var_01,iVar3) == 0) {
        __assert_fail("c->AsScalarConstant()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x21a,
                      "bool spvtools::opt::(anonymous namespace)::HasZero(const analysis::Constant *)"
                     );
      }
      iVar3 = (*c->_vptr_Constant[0xd])();
      bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xb8))();
      c_local._7_1_ = (bool)(bVar2 & 1);
    }
    else {
      this = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xc0))();
      __end3 = std::
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ::begin(this);
      comp = (Constant **)
             std::
             vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             ::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                         *)&comp), bVar1) {
        ppCVar4 = __gnu_cxx::
                  __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                  ::operator*(&__end3);
        bVar1 = HasZero(*ppCVar4);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
        ::operator++(&__end3);
      }
      c_local._7_1_ = false;
    }
  }
  else {
    c_local._7_1_ = true;
  }
  return c_local._7_1_;
}

Assistant:

bool HasZero(const analysis::Constant* c) {
  if (c->AsNullConstant()) {
    return true;
  }
  if (const analysis::VectorConstant* vec_const = c->AsVectorConstant()) {
    for (auto& comp : vec_const->GetComponents())
      if (HasZero(comp)) return true;
  } else {
    assert(c->AsScalarConstant());
    return c->AsScalarConstant()->IsZero();
  }

  return false;
}